

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFile.c
# Opt level: O2

char * NewtBaseName(char *s,uint32_t len)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  
  uVar1 = 0;
  uVar3 = 0;
  while (len != uVar1) {
    pcVar2 = s + uVar1;
    uVar1 = uVar1 + 1;
    if (*pcVar2 == '/') {
      uVar3 = uVar1 & 0xffffffff;
    }
  }
  pcVar2 = (char *)0x0;
  if ((uint)uVar3 < len) {
    pcVar2 = s + uVar3;
  }
  return pcVar2;
}

Assistant:

char * NewtBaseName(char * s, uint32_t len)
{
    uint32_t	base = 0;
    uint32_t	i;
    char		sep;
    
    sep = NewtGetFileSeparator();
    
    for (i = 0; i < len; i++)
    {
        if (s[i] == sep)
            base = i + 1;
    }
    
    if (base < len)
        return (s + base);
    else
        return NULL;
}